

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test::testBody
          (TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  GlobalSimpleStringMemoryAccountant *this_00;
  GlobalSimpleStringMemoryAccountant local_48 [2];
  undefined1 local_28 [8];
  SimpleString str;
  size_t caches [1];
  TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this_local;
  
  str.bufferSize_ = 0x20;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant;
  GlobalSimpleStringMemoryAccountant::useCacheSizes(this_00,&str.bufferSize_,1);
  SimpleString::SimpleString((SimpleString *)local_28,"");
  GlobalSimpleStringMemoryAccountant::start(this_00);
  SimpleString::operator+=((SimpleString *)local_28,"More");
  GlobalSimpleStringMemoryAccountant::stop
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant);
  pUVar1 = UtestShell::getCurrent();
  GlobalSimpleStringMemoryAccountant::report(local_48);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_48);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"32                   1                1                 1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x98);
  SimpleString::~SimpleString((SimpleString *)local_48);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, reportUseCaches)
{
    size_t caches[] = {32};
    accountant.useCacheSizes(caches, 1);
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS("32                   1                1                 1", accountant.report().asCharString());
}